

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O3

int WebRtcVad_CalcVad8khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  int16_t iVar5;
  ushort uVar6;
  int16_t iVar7;
  int32_t weighted_average_1;
  int32_t iVar8;
  int iVar9;
  sbyte sVar10;
  short sVar11;
  int32_t weighted_average;
  uint uVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  short sVar16;
  long lVar17;
  uint *puVar18;
  uint uVar19;
  short sVar20;
  long lVar21;
  short sVar22;
  short sVar23;
  long lVar24;
  short sVar25;
  short sVar26;
  uint uVar27;
  uint *puVar28;
  bool bVar29;
  uint uVar30;
  int iVar31;
  int16_t *piVar32;
  int16_t feature_vector [6];
  int16_t sgprvec [12];
  int16_t ngprvec [12];
  int16_t deltaS [12];
  int16_t deltaN [12];
  uint local_d4;
  uint local_d0;
  int16_t local_cc [6];
  VadInstT *local_c0;
  int16_t *local_b8;
  uint local_b0;
  uint local_ac;
  short local_a8 [16];
  short local_88 [16];
  short asStack_68 [16];
  short asStack_48 [12];
  
  iVar5 = WebRtcVad_CalculateFeatures(inst,speech_frame,frame_length,local_cc);
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  if (frame_length == 0x50) {
    lVar17 = 0x2d6;
    lVar14 = 0x2d0;
    lVar21 = 0x2ca;
    lVar24 = 0x2c4;
  }
  else if (frame_length == 0xa0) {
    lVar17 = 0x2d8;
    lVar14 = 0x2d2;
    lVar21 = 0x2cc;
    lVar24 = 0x2c6;
  }
  else {
    lVar17 = 0x2da;
    lVar14 = 0x2d4;
    lVar21 = 0x2ce;
    lVar24 = 0x2c8;
  }
  if (10 < iVar5) {
    sVar23 = *(short *)((long)inst->downsampling_filter_states + lVar17 + -4);
    iVar5 = *(int16_t *)((long)inst->downsampling_filter_states + lVar21 + -4);
    iVar7 = *(int16_t *)((long)inst->downsampling_filter_states + lVar24 + -4);
    sVar16 = *(short *)((long)inst->downsampling_filter_states + lVar14 + -4);
    local_c0 = inst;
    lVar14 = 0;
    iVar13 = 0;
    bVar4 = false;
    local_b8 = inst->speech_stds;
    do {
      puVar18 = &local_d4;
      puVar28 = &local_d0;
      lVar17 = 0;
      uVar27 = 0;
      uVar19 = 0;
      bVar3 = true;
      do {
        bVar29 = bVar3;
        lVar17 = lVar17 + lVar14;
        iVar8 = WebRtcVad_GaussianProbability
                          (local_cc[lVar14],inst->noise_means[lVar17],inst->noise_stds[lVar17],
                           asStack_48 + lVar17);
        sVar20 = kNoiseDataWeights[lVar17];
        *puVar28 = sVar20 * iVar8;
        uVar19 = uVar19 + sVar20 * iVar8;
        iVar8 = WebRtcVad_GaussianProbability
                          (local_cc[lVar14],inst->speech_means[lVar17],local_b8[lVar17],
                           asStack_68 + lVar17);
        sVar20 = kSpeechDataWeights[lVar17];
        *puVar18 = sVar20 * iVar8;
        uVar27 = uVar27 + sVar20 * iVar8;
        lVar17 = 6;
        puVar18 = &local_b0;
        puVar28 = &local_ac;
        bVar3 = false;
      } while (bVar29);
      iVar9 = 0x1f;
      iVar31 = 0x1f;
      if (uVar19 != 0) {
        uVar12 = (int)uVar19 >> 0x1f ^ uVar19;
        if (uVar12 == 0) {
          uVar30 = 0x20;
        }
        else {
          uVar30 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          uVar30 = uVar30 ^ 0x1f;
        }
        iVar31 = uVar30 - 1;
      }
      if (uVar27 != 0) {
        uVar12 = (int)uVar27 >> 0x1f ^ uVar27;
        if (uVar12 == 0) {
          uVar30 = 0x20;
        }
        else {
          uVar30 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          uVar30 = uVar30 ^ 0x1f;
        }
        iVar9 = uVar30 - 1;
      }
      sVar20 = kSpectrumWeight[lVar14];
      if ((int)sVar16 < (iVar31 - iVar9) * 4) {
        bVar4 = true;
      }
      sVar11 = (short)(uVar19 >> 0xc);
      if (sVar11 < 1) {
        sVar11 = 0x4000;
      }
      else {
        iVar8 = WebRtcSpl_DivW32W16((local_d0 & 0x3ffff000) << 2,sVar11);
        sVar11 = (short)iVar8;
        local_88[lVar14 + 6] = 0x4000 - sVar11;
      }
      local_88[lVar14] = sVar11;
      sVar11 = (short)(uVar27 >> 0xc);
      if (0 < sVar11) {
        iVar8 = WebRtcSpl_DivW32W16((local_d4 & 0x3ffff000) << 2,sVar11);
        local_a8[lVar14] = (short)iVar8;
        local_a8[lVar14 + 6] = 0x4000 - (short)iVar8;
      }
      iVar13 = iVar13 + (iVar31 - iVar9) * (int)sVar20;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    bVar3 = sVar23 <= iVar13;
    sVar23 = 0x3200;
    lVar14 = 0;
    do {
      uVar6 = WebRtcVad_FindMinimum(local_c0,local_cc[lVar14],(int)lVar14);
      lVar17 = 0;
      uVar19 = 0;
      bVar29 = true;
      do {
        bVar15 = bVar29;
        uVar19 = uVar19 + (int)kNoiseDataWeights[lVar14 + lVar17] *
                          (int)inst->noise_means[lVar14 + lVar17];
        lVar17 = 6;
        bVar29 = false;
      } while (bVar15);
      sVar16 = 0x48 - (short)lVar14;
      lVar17 = 0;
      bVar29 = true;
      do {
        bVar15 = bVar29;
        lVar21 = lVar14 + lVar17 * 6;
        sVar20 = inst->noise_means[lVar21];
        sVar11 = (short)lVar17;
        sVar22 = (short)((uint)(((int)((uint)uVar6 * 0x100000 + (uVar19 & 0xffffffc0) * -0x400) >>
                                0x10) * 0x4d00) >> 0x10);
        if (bVar4 || bVar3) {
          piVar32 = local_b8 + lVar21;
          sVar26 = *piVar32;
          sVar1 = inst->speech_means[lVar21];
          sVar20 = sVar20 + sVar22;
          sVar22 = sVar11 * 0x80 + 0x280;
          if (sVar22 < sVar20) {
            sVar22 = sVar20;
          }
          sVar20 = (sVar16 + sVar11) * 0x80;
          if (sVar22 < sVar20) {
            sVar20 = sVar22;
          }
          inst->noise_means[lVar21] = sVar20;
          sVar20 = local_a8[lVar21];
          sVar11 = asStack_68[lVar21];
          sVar22 = (short)(((short)((uint)((int)sVar20 * (int)sVar11) >> 0xb) * 0x199a >> 0x15) + 1U
                          >> 1) + sVar1;
          if (sVar22 <= kMinimumMean[lVar17]) {
            sVar22 = kMinimumMean[lVar17];
          }
          if ((short)(sVar23 + 0x280) <= sVar22) {
            sVar22 = sVar23 + 0x280;
          }
          inst->speech_means[lVar21] = sVar22;
          iVar13 = ((int)sVar20 >> 2) *
                   (((int)(short)(local_cc[lVar14] -
                                 (short)((uint)(sVar1 * 0x2000 + 0x8000) >> 0x10)) * (int)sVar11 >>
                    3) + -0x1000) >> 4;
          if (iVar13 < 1) {
            iVar8 = WebRtcSpl_DivW32W16(-iVar13,sVar26 * 10);
            iVar13 = -iVar8;
          }
          else {
            iVar13 = WebRtcSpl_DivW32W16(iVar13,sVar26 * 10);
          }
          sVar10 = 0x18;
          iVar9 = 0x800000;
        }
        else {
          piVar32 = inst->noise_stds + lVar21;
          sVar26 = *piVar32;
          sVar1 = local_88[lVar21];
          sVar2 = asStack_48[lVar21];
          sVar25 = (short)((short)((uint)((int)sVar1 * (int)sVar2) >> 0xb) * 0x28f >> 0x16) +
                   sVar22 + sVar20;
          sVar22 = sVar11 * 0x80 + 0x280;
          if (sVar22 < sVar25) {
            sVar22 = sVar25;
          }
          sVar11 = (sVar11 + sVar16) * 0x80;
          if (sVar22 < sVar11) {
            sVar11 = sVar22;
          }
          inst->noise_means[lVar21] = sVar11;
          iVar13 = (sVar1 * 0x4000 + 0x8000 >> 0x10) *
                   (((int)(short)(local_cc[lVar14] - (sVar20 >> 3)) * (int)sVar2 >> 3) + -0x1000) >>
                   0xe;
          if (iVar13 < 1) {
            iVar8 = WebRtcSpl_DivW32W16(-iVar13,sVar26);
            iVar13 = -iVar8;
          }
          else {
            iVar13 = WebRtcSpl_DivW32W16(iVar13,sVar26);
          }
          sVar10 = 0x16;
          iVar9 = 0x200000;
        }
        sVar26 = sVar26 + (short)(iVar13 * 0x10000 + iVar9 >> sVar10);
        if (sVar26 < 0x181) {
          sVar26 = 0x180;
        }
        *piVar32 = sVar26;
        lVar17 = 1;
        uVar27 = 0;
        bVar29 = false;
      } while (bVar15);
      lVar17 = 0;
      bVar29 = true;
      do {
        bVar15 = bVar29;
        uVar27 = uVar27 + (int)kNoiseDataWeights[lVar14 + lVar17] *
                          (int)inst->noise_means[lVar14 + lVar17];
        lVar17 = 6;
        uVar19 = 0;
        bVar29 = false;
      } while (bVar15);
      lVar17 = 0;
      bVar29 = true;
      do {
        bVar15 = bVar29;
        uVar19 = uVar19 + (int)kSpeechDataWeights[lVar14 + lVar17] *
                          (int)inst->speech_means[lVar14 + lVar17];
        lVar17 = 6;
        bVar29 = false;
      } while (bVar15);
      sVar23 = (short)(uVar19 >> 9) - (short)(uVar27 >> 9);
      if (sVar23 < kMinimumDifference[lVar14]) {
        iVar13 = (int)(short)(kMinimumDifference[lVar14] - sVar23);
        lVar17 = 0;
        uVar19 = 0;
        bVar29 = true;
        do {
          bVar15 = bVar29;
          sVar23 = inst->speech_means[lVar14 + lVar17] + (short)((uint)(iVar13 * 0xd) >> 2);
          inst->speech_means[lVar14 + lVar17] = sVar23;
          uVar19 = uVar19 + (int)kSpeechDataWeights[lVar14 + lVar17] * (int)sVar23;
          lVar17 = 6;
          uVar27 = 0;
          bVar29 = false;
        } while (bVar15);
        lVar17 = 0;
        bVar29 = true;
        do {
          bVar15 = bVar29;
          sVar23 = inst->noise_means[lVar14 + lVar17] - (short)((uint)(iVar13 * 0xc000) >> 0x10);
          inst->noise_means[lVar14 + lVar17] = sVar23;
          uVar27 = uVar27 + (int)kNoiseDataWeights[lVar14 + lVar17] * (int)sVar23;
          lVar17 = 6;
          bVar29 = false;
        } while (bVar15);
      }
      sVar23 = kMaximumSpeech[lVar14];
      sVar16 = (short)(uVar19 >> 7);
      if (sVar23 < sVar16) {
        sVar16 = sVar23 - sVar16;
        inst->speech_means[lVar14] = inst->speech_means[lVar14] + sVar16;
        inst->speech_means[lVar14 + 6] = inst->speech_means[lVar14 + 6] + sVar16;
      }
      sVar16 = (short)(uVar27 >> 7);
      if (kMaximumNoise[lVar14] < sVar16) {
        sVar16 = kMaximumNoise[lVar14] - sVar16;
        inst->noise_means[lVar14] = inst->noise_means[lVar14] + sVar16;
        inst->noise_means[lVar14 + 6] = inst->noise_means[lVar14 + 6] + sVar16;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    local_c0->frame_counter = local_c0->frame_counter + 1;
    inst = local_c0;
    if (bVar4 || bVar3) {
      sVar23 = local_c0->num_of_speech + 1;
      local_c0->num_of_speech = sVar23;
      if (6 < sVar23) {
        local_c0->num_of_speech = 6;
        iVar7 = iVar5;
      }
      local_c0->over_hang = iVar7;
      iVar13 = 1;
      goto LAB_001211e4;
    }
  }
  sVar23 = inst->over_hang;
  if (sVar23 < 1) {
    iVar13 = 0;
  }
  else {
    inst->over_hang = sVar23 + -1;
    iVar13 = (int)(short)(sVar23 + 2);
  }
  inst->num_of_speech = 0;
  local_c0 = inst;
LAB_001211e4:
  local_c0->vad = iVar13;
  return iVar13;
}

Assistant:

int WebRtcVad_CalcVad8khz(VadInstT* inst, const int16_t* speech_frame,
                          size_t frame_length)
{
    int16_t feature_vector[kNumChannels], total_power;

    // Get power in the bands
    total_power = WebRtcVad_CalculateFeatures(inst, speech_frame, frame_length,
                                              feature_vector);

    // Make a VAD
    inst->vad = GmmProbability(inst, feature_vector, total_power, frame_length);

    return inst->vad;
}